

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWriteVer.c
# Opt level: O2

int Wlc_ObjFaninBitNum(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  int i;
  int iVar4;
  
  iVar4 = 0;
  for (i = 0; i < (int)pObj->nFanins; i = i + 1) {
    iVar1 = Wlc_ObjFaninId(pObj,i);
    pWVar2 = Wlc_NtkObj(p,iVar1);
    iVar3 = pWVar2->End - pWVar2->Beg;
    iVar1 = -iVar3;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    iVar4 = iVar4 + iVar1 + 1;
  }
  return iVar4;
}

Assistant:

int Wlc_ObjFaninBitNum( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    Wlc_Obj_t * pFanin;
    int i, Count = 0;
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        Count += Wlc_ObjRange(pFanin);
    return Count;
}